

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void mark(Object *object)

{
  int *piVar1;
  CrispyValue *current_1;
  int i_1;
  ObjList *list;
  HTItem *current;
  int i;
  ObjDict *dict;
  Object *object_local;
  
  if (object->marked == '\0') {
    if (object->type == OBJ_DICT) {
      for (current._4_4_ = OBJ_STRING; current._4_4_ < object[1].type;
          current._4_4_ = current._4_4_ + OBJ_LAMBDA) {
        for (list = *(ObjList **)(&(object[2].next)->marked + (long)(int)current._4_4_ * 8);
            list != (ObjList *)0x0; list = (ObjList *)(list->content).values) {
          mark(*(Object **)&list->object);
          if ((int)(list->content).cap == 2) {
            mark((Object *)(list->content).count);
          }
        }
      }
    }
    else if (object->type == OBJ_LIST) {
      for (current_1._4_4_ = 0; (object_t *)(long)current_1._4_4_ < object[1].next;
          current_1._4_4_ = current_1._4_4_ + 1) {
        piVar1 = (int *)(*(long *)(object + 2) + (long)current_1._4_4_ * 0x10);
        if (*piVar1 == 2) {
          mark(*(Object **)(piVar1 + 2));
        }
      }
    }
    object->marked = '\x01';
  }
  return;
}

Assistant:

static void mark(Object *object) {
    if (object->marked) { return; }

    if (object->type == OBJ_DICT) {
        ObjDict *dict = (ObjDict *) object;

        for (int i = 0; i < dict->content.cap; ++i) {
            HTItem *current = dict->content.buckets[i];

            while (current) {
                mark((Object *) current->key.key_obj_string);

                if (current->value.type == OBJECT) {
                    mark(current->value.o_value);
                }

                current = current->next;
            }
        }

    } else if (object->type == OBJ_LIST) {
        ObjList *list = (ObjList *) object;

        for (int i = 0; i < list->content.count; ++i) {
            CrispyValue *current = &list->content.values[i];

            if (current->type == OBJECT) {
                mark(current->o_value);
            }
        }
    }

    object->marked = 1;
}